

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraKateGenerator::CreateKateProjectFile(cmExtraKateGenerator *this,cmLocalGenerator *lg)

{
  byte bVar1;
  string *psVar2;
  ostream *poVar3;
  bool bVar4;
  string local_330;
  uint local_310;
  undefined1 local_300 [8];
  cmGeneratedFileStream fout;
  cmAlphaNum local_68;
  undefined1 local_38 [8];
  string filename;
  cmLocalGenerator *lg_local;
  cmExtraKateGenerator *this_local;
  
  filename.field_2._8_8_ = lg;
  psVar2 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
  cmAlphaNum::cmAlphaNum(&local_68,psVar2);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&fout.field_0x260,"/.kateproject");
  cmStrCat<>((string *)local_38,&local_68,(cmAlphaNum *)&fout.field_0x260);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_300,(string *)local_38,false,None);
  bVar1 = std::ios::operator!((ios *)(local_300 + (long)*(_func_int **)((long)local_300 + -0x18)));
  bVar4 = (bVar1 & 1) != 0;
  if (!bVar4) {
    poVar3 = std::operator<<((ostream *)local_300,"{\n\t\"name\": \"");
    poVar3 = std::operator<<(poVar3,(string *)&this->ProjectName);
    poVar3 = std::operator<<(poVar3,"\",\n\t\"directory\": \"");
    psVar2 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_
                       ((cmLocalGenerator *)filename.field_2._8_8_);
    poVar3 = std::operator<<(poVar3,(string *)psVar2);
    poVar3 = std::operator<<(poVar3,"\",\n\t\"files\": [ { ");
    GenerateFilesString_abi_cxx11_(&local_330,this,(cmLocalGenerator *)filename.field_2._8_8_);
    poVar3 = std::operator<<(poVar3,(string *)&local_330);
    std::operator<<(poVar3,"} ],\n");
    std::__cxx11::string::~string((string *)&local_330);
    WriteTargets(this,(cmLocalGenerator *)filename.field_2._8_8_,(cmGeneratedFileStream *)local_300)
    ;
    std::operator<<((ostream *)local_300,"}\n");
  }
  local_310 = (uint)bVar4;
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_300);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmExtraKateGenerator::CreateKateProjectFile(
  const cmLocalGenerator& lg) const
{
  std::string filename = cmStrCat(lg.GetBinaryDirectory(), "/.kateproject");
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  /* clang-format off */
  fout <<
    "{\n"
    "\t\"name\": \"" << this->ProjectName << "\",\n"
    "\t\"directory\": \"" << lg.GetSourceDirectory() << "\",\n"
    "\t\"files\": [ { " << this->GenerateFilesString(lg) << "} ],\n";
  /* clang-format on */
  this->WriteTargets(lg, fout);
  fout << "}\n";
}